

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

cmJSONHelper<int,_cmCMakePresetsGraph::ReadFileResult> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
Required<int,std::function<cmCMakePresetsGraph::ReadFileResult(int&,Json::Value_const*)>>
          (cmJSONHelper<int,_cmCMakePresetsGraph::ReadFileResult> *__return_storage_ptr__,
          cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult> *this,ReadFileResult fail,
          function<cmCMakePresetsGraph::ReadFileResult_(int_&,_const_Json::Value_*)> *func)

{
  undefined4 in_register_00000014;
  anon_class_40_2_3f1793ff local_48;
  function<cmCMakePresetsGraph::ReadFileResult_(int_&,_const_Json::Value_*)> *local_20;
  function<cmCMakePresetsGraph::ReadFileResult_(int_&,_const_Json::Value_*)> *func_local;
  cmJSONHelper<int,_cmCMakePresetsGraph::ReadFileResult> *pcStack_10;
  ReadFileResult fail_local;
  
  local_20 = (function<cmCMakePresetsGraph::ReadFileResult_(int_&,_const_Json::Value_*)> *)
             CONCAT44(in_register_00000014,fail);
  local_48.fail = (ReadFileResult)this;
  func_local._4_4_ = local_48.fail;
  pcStack_10 = __return_storage_ptr__;
  std::function<cmCMakePresetsGraph::ReadFileResult_(int_&,_const_Json::Value_*)>::function
            (&local_48.func,local_20);
  std::function<cmCMakePresetsGraph::ReadFileResult(int&,Json::Value_const*)>::
  function<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Required<int,std::function<cmCMakePresetsGraph::ReadFileResult(int&,Json::Value_const*)>>(cmCMakePresetsGraph::ReadFileResult,std::function<cmCMakePresetsGraph::ReadFileResult(int&,Json::Value_const*)>)::_lambda(int&,Json::Value_const*)_1_,void>
            ((function<cmCMakePresetsGraph::ReadFileResult(int&,Json::Value_const*)> *)
             __return_storage_ptr__,&local_48);
  Required<int,std::function<cmCMakePresetsGraph::ReadFileResult(int&,Json::Value_const*)>>(cmCMakePresetsGraph::ReadFileResult,std::function<cmCMakePresetsGraph::ReadFileResult(int&,Json::Value_const*)>)
  ::{lambda(int&,Json::Value_const*)#1}::~Required((_lambda_int__Json__Value_const___1_ *)&local_48)
  ;
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<T, E, CallState...> Required(E fail, F func)
  {
    return [fail, func](T& out, const Json::Value* value,
                        CallState&&... state) -> E {
      if (!value) {
        return fail;
      }
      return func(out, value, std::forward(state)...);
    };
  }